

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::Parser::ParseMultiName_abi_cxx11_
          (String *__return_storage_ptr__,Parser *this,
          initializer_list<Jinx::Impl::SymbolType> symbols)

{
  SymbolType SVar1;
  bool bVar2;
  pointer pSVar3;
  const_iterator pSVar4;
  byte local_91;
  bool local_6d;
  SymbolType symbol;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<Jinx::Impl::SymbolType> *__range4;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_30;
  Parser *local_28;
  Parser *this_local;
  initializer_list<Jinx::Impl::SymbolType> symbols_local;
  String *s;
  
  symbols_local._M_array = (iterator)symbols._M_len;
  this_local = (Parser *)symbols._M_array;
  local_6d = true;
  local_28 = this;
  symbols_local._M_len = (size_type)__return_storage_ptr__;
  if ((this->m_error & 1U) == 0) {
    local_30._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    local_6d = __gnu_cxx::operator==(&this->m_currentSymbol,&local_30);
  }
  if (local_6d == false) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    if (pSVar3->type == NameValue) {
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__,&pSVar3->text);
      NextSymbol(this);
      while( true ) {
        bVar2 = IsSymbolValid(this,(this->m_currentSymbol)._M_current);
        local_91 = 0;
        if (bVar2) {
          pSVar3 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&this->m_currentSymbol);
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  empty(&pSVar3->text);
          local_91 = bVar2 ^ 0xff;
        }
        if ((local_91 & 1) == 0) break;
        pSVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&this->m_currentSymbol);
        if (pSVar3->type != NameValue) {
          __end4 = std::initializer_list<Jinx::Impl::SymbolType>::begin
                             ((initializer_list<Jinx::Impl::SymbolType> *)&this_local);
          pSVar4 = std::initializer_list<Jinx::Impl::SymbolType>::end
                             ((initializer_list<Jinx::Impl::SymbolType> *)&this_local);
          for (; __end4 != pSVar4; __end4 = __end4 + 1) {
            SVar1 = *__end4;
            pSVar3 = __gnu_cxx::
                     __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                     ::operator->(&this->m_currentSymbol);
            if (pSVar3->type == SVar1) {
              return __return_storage_ptr__;
            }
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__," ");
        pSVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&this->m_currentSymbol);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__,&pSVar3->text);
        NextSymbol(this);
      }
    }
    else {
      Error<>(this,"Unexpected symbol type when parsing name");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseMultiName(std::initializer_list<SymbolType> symbols)
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();

		while (IsSymbolValid(m_currentSymbol) && !m_currentSymbol->text.empty())
		{
			if (m_currentSymbol->type != SymbolType::NameValue)
			{
				for (auto symbol : symbols)
				{
					if (m_currentSymbol->type == symbol)
						return s;
				}
			}
			s += " ";
			s += m_currentSymbol->text;
			NextSymbol();
		}

		return s;
	}